

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void __thiscall wabt::interp::Object::~Object(Object *this)

{
  Finalizer *pFVar1;
  _Manager_type p_Var2;
  Object *in_RAX;
  Object *local_18;
  
  this->_vptr_Object = (_func_int **)&PTR__Object_001d4fe0;
  pFVar1 = &this->finalizer_;
  local_18 = in_RAX;
  if ((this->finalizer_).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_18 = this;
    (*(this->finalizer_)._M_invoker)((_Any_data *)pFVar1,&local_18);
  }
  p_Var2 = (this->finalizer_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)pFVar1,(_Any_data *)pFVar1,__destroy_functor);
  }
  return;
}

Assistant:

Object::~Object() {
  if (finalizer_) {
    finalizer_(this);
  }
}